

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_fill_range(mpack_reader_t *reader,char *p,size_t min_bytes,size_t max_bytes)

{
  mpack_error_t mVar1;
  size_t sVar2;
  size_t read;
  size_t count;
  size_t max_bytes_local;
  size_t min_bytes_local;
  char *p_local;
  mpack_reader_t *reader_local;
  
  read = 0;
  while( true ) {
    if (min_bytes <= read) {
      return read;
    }
    sVar2 = (*reader->fill)(reader,p + read,max_bytes - read);
    mVar1 = mpack_reader_error(reader);
    if (mVar1 != mpack_ok) break;
    if ((sVar2 == 0) || (sVar2 == 0xffffffffffffffff)) {
      mpack_reader_flag_error(reader,mpack_error_io);
      return 0;
    }
    read = sVar2 + read;
  }
  return 0;
}

Assistant:

MPACK_NOINLINE static size_t mpack_fill_range(mpack_reader_t* reader, char* p, size_t min_bytes, size_t max_bytes) {
    mpack_assert(reader->fill != NULL, "mpack_fill_range() called with no fill function?");
    mpack_assert(min_bytes > 0, "cannot fill zero bytes!");
    mpack_assert(max_bytes >= min_bytes, "min_bytes %i cannot be larger than max_bytes %i!",
            (int)min_bytes, (int)max_bytes);

    size_t count = 0;
    while (count < min_bytes) {
        size_t read = reader->fill(reader, p + count, max_bytes - count);

        // Reader fill functions can flag an error or return 0 on failure. We
        // also guard against functions that -1 just in case.
        if (mpack_reader_error(reader) != mpack_ok)
            return 0;
        if (read == 0 || read == ((size_t)(-1))) {
            mpack_reader_flag_error(reader, mpack_error_io);
            return 0;
        }

        count += read;
    }
    return count;
}